

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprListDeleteNN(sqlite3 *db,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  
  pEVar2 = pList->a;
  iVar1 = pList->nExpr + 1;
  do {
    sqlite3ExprDelete(db,pEVar2->pExpr);
    sqlite3DbFree(db,pEVar2->zEName);
    pEVar2 = pEVar2 + 1;
    iVar1 = iVar1 + -1;
  } while (1 < iVar1);
  sqlite3DbFreeNN(db,pList);
  return;
}

Assistant:

static SQLITE_NOINLINE void exprListDeleteNN(sqlite3 *db, ExprList *pList){
  int i = pList->nExpr;
  struct ExprList_item *pItem =  pList->a;
  assert( pList->nExpr>0 );
  do{
    sqlite3ExprDelete(db, pItem->pExpr);
    sqlite3DbFree(db, pItem->zEName);
    pItem++;
  }while( --i>0 );
  sqlite3DbFreeNN(db, pList);
}